

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder.h
# Opt level: O0

EnumDeclarationSymbol * __thiscall
psy::C::DeclarationBinder::bindDeclaration<psy::C::EnumDeclarationSymbol,psy::C::TagType*>
          (DeclarationBinder *this,SyntaxNode *node,TagType *args)

{
  SyntaxTree *tree;
  SemanticModel *this_00;
  EnumDeclarationSymbol *pEVar1;
  Symbol *containingSym;
  reference ppSVar2;
  unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_> local_48;
  EnumDeclarationSymbol *local_40;
  EnumDeclarationSymbol *decl;
  unique_ptr<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
  local_28;
  unique_ptr<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
  newDecl;
  TagType *args_local;
  SyntaxNode *node_local;
  DeclarationBinder *this_local;
  
  newDecl._M_t.
  super___uniq_ptr_impl<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
  ._M_t.
  super__Tuple_impl<0UL,_psy::C::EnumDeclarationSymbol_*,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
  .super__Head_base<0UL,_psy::C::EnumDeclarationSymbol_*,_false>._M_head_impl =
       (__uniq_ptr_data<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>,_true,_true>
        )(__uniq_ptr_data<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>,_true,_true>
          )args;
  pEVar1 = (EnumDeclarationSymbol *)operator_new(0x28);
  containingSym = containingUnitOrDeclaration(this);
  tree = (this->super_SyntaxVisitor).tree_;
  ppSVar2 = std::
            stack<psy::C::Scope_*,_std::deque<psy::C::Scope_*,_std::allocator<psy::C::Scope_*>_>_>::
            top(&this->scopes_);
  EnumDeclarationSymbol::EnumDeclarationSymbol
            (pEVar1,containingSym,tree,*ppSVar2,
             (TagType *)
             newDecl._M_t.
             super___uniq_ptr_impl<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_psy::C::EnumDeclarationSymbol_*,_std::default_delete<psy::C::EnumDeclarationSymbol>_>
             .super__Head_base<0UL,_psy::C::EnumDeclarationSymbol_*,_false>._M_head_impl);
  std::unique_ptr<psy::C::EnumDeclarationSymbol,std::default_delete<psy::C::EnumDeclarationSymbol>>
  ::unique_ptr<std::default_delete<psy::C::EnumDeclarationSymbol>,void>
            ((unique_ptr<psy::C::EnumDeclarationSymbol,std::default_delete<psy::C::EnumDeclarationSymbol>>
              *)&local_28,pEVar1);
  this_00 = this->semaModel_;
  std::unique_ptr<psy::C::DeclarationSymbol,std::default_delete<psy::C::DeclarationSymbol>>::
  unique_ptr<psy::C::EnumDeclarationSymbol,std::default_delete<psy::C::EnumDeclarationSymbol>,void>
            ((unique_ptr<psy::C::DeclarationSymbol,std::default_delete<psy::C::DeclarationSymbol>> *
             )&local_48,&local_28);
  pEVar1 = (EnumDeclarationSymbol *)SemanticModel::addDeclaration(this_00,node,&local_48);
  std::unique_ptr<psy::C::DeclarationSymbol,_std::default_delete<psy::C::DeclarationSymbol>_>::
  ~unique_ptr(&local_48);
  local_40 = pEVar1;
  pushDeclaration(this,(DeclarationSymbol *)pEVar1);
  pEVar1 = local_40;
  std::
  unique_ptr<psy::C::EnumDeclarationSymbol,_std::default_delete<psy::C::EnumDeclarationSymbol>_>::
  ~unique_ptr(&local_28);
  return pEVar1;
}

Assistant:

DeclSymT* DeclarationBinder::bindDeclaration(const SyntaxNode* node, DeclSymTArgs... args)
{
    std::unique_ptr<DeclSymT> newDecl(
                new DeclSymT(containingUnitOrDeclaration(),
                             tree_,
                             scopes_.top(),
                             std::forward<DeclSymTArgs>(args)...));
    auto decl = static_cast<DeclSymT*>(semaModel_->addDeclaration(node, std::move(newDecl)));
    pushDeclaration(decl);
    return decl;
}